

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar7;
  int i_5;
  int size_3;
  float *outptr_4;
  int i_4;
  float max;
  float min;
  int size_2;
  float *outptr_3;
  int i_3;
  float slope;
  int size_1;
  float *outptr_2;
  int i_2;
  int size;
  float *outptr_1;
  float w_1;
  int k;
  float val;
  Mat m;
  int q;
  float *kptr;
  float *outptr;
  int j_1;
  int i_1;
  float bias;
  Mat out;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  Mat top_blob_bordered;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  int in_stack_00000358;
  int in_stack_0000035c;
  int in_stack_00000360;
  int in_stack_00000364;
  Mat *in_stack_00000368;
  Mat *in_stack_00000370;
  Allocator *in_stack_00000380;
  int in_stack_00000388;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 uVar8;
  int in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd68;
  float in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  float in_stack_fffffffffffffd74;
  size_type in_stack_fffffffffffffd78;
  Mat *in_stack_fffffffffffffd80;
  float local_264;
  float local_224;
  int local_1f8;
  int local_1e8;
  int local_1cc;
  float local_1b4;
  int local_1b0;
  int local_1ac;
  float *local_1a8;
  float local_19c;
  int local_198;
  float local_194;
  Mat local_190;
  int local_14c;
  float *local_148;
  float *local_140;
  int local_134;
  int local_130;
  float local_12c;
  Mat local_128;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  reference local_d0;
  vector<int,_std::allocator<int>_> local_c0;
  int local_a4;
  undefined4 local_a0;
  Mat local_90;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  long local_20;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = *(int *)(in_RDI + 0x8c) * (*(int *)(in_RDI + 0x84) + -1) + 1;
  local_48 = *(int *)(in_RDI + 0x90) * (*(int *)(in_RDI + 0x88) + -1) + 1;
  local_4c = (local_2c + -1) * *(int *)(in_RDI + 0x94) + local_44;
  local_50 = (local_30 + -1) * *(int *)(in_RDI + 0x98) + local_48;
  local_28 = in_RCX;
  local_20 = in_RDX;
  Mat::Mat(&local_90);
  if ((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) {
    Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    Mat::create(in_stack_fffffffffffffd80,(int)(in_stack_fffffffffffffd78 >> 0x20),
                (int)in_stack_fffffffffffffd78,(int)in_stack_fffffffffffffd74,
                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                (Allocator *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    bVar3 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    if (bVar3) {
      local_4 = -100;
      local_a0 = 1;
      goto LAB_0015c74d;
    }
  }
  else {
    Mat::create(in_stack_fffffffffffffd80,(int)(in_stack_fffffffffffffd78 >> 0x20),
                (int)in_stack_fffffffffffffd78,(int)in_stack_fffffffffffffd74,
                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                (Allocator *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    bVar3 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    if (bVar3) {
      local_4 = -100;
      local_a0 = 1;
      goto LAB_0015c74d;
    }
  }
  local_a4 = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
  std::allocator<int>::allocator((allocator<int> *)0x15bcce);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  std::allocator<int>::~allocator((allocator<int> *)0x15bcfa);
  local_d0 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,0);
  local_d4 = 0;
  local_d8 = 0;
  local_dc = local_4c * *(int *)(in_RDI + 0x90) - *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x8c);
  for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0x88); local_e0 = local_e0 + 1) {
    for (local_e4 = 0; local_e4 < *(int *)(in_RDI + 0x84); local_e4 = local_e4 + 1) {
      local_d0[local_d4] = local_d8;
      local_d4 = local_d4 + 1;
      local_d8 = *(int *)(in_RDI + 0x8c) + local_d8;
    }
    local_d8 = local_dc + local_d8;
  }
  for (local_e8 = 0; local_e8 < *(int *)(in_RDI + 0x80); local_e8 = local_e8 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                 in_stack_fffffffffffffd64);
    if (*(int *)(in_RDI + 0xa4) == 0) {
      local_224 = 0.0;
    }
    else {
      pfVar5 = Mat::operator[]((Mat *)(in_RDI + 0x130),local_e8);
      local_224 = *pfVar5;
    }
    local_12c = local_224;
    Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
              in_stack_fffffffffffffd6c);
    for (local_130 = 0; local_130 < local_30; local_130 = local_130 + 1) {
      for (local_134 = 0; local_134 < local_2c; local_134 = local_134 + 1) {
        local_140 = Mat::row(&local_128,local_130 * *(int *)(in_RDI + 0x98));
        local_140 = local_140 + local_134 * *(int *)(in_RDI + 0x94);
        local_148 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xf0));
        local_148 = local_148 + local_a4 * local_34 * local_e8;
        for (local_14c = 0; local_14c < local_34; local_14c = local_14c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                       in_stack_fffffffffffffd64);
          pfVar5 = Mat::row(&local_190,local_130);
          local_194 = pfVar5[local_134];
          for (local_198 = 0; local_198 < local_a4; local_198 = local_198 + 1) {
            local_19c = local_148[local_198];
            local_140[local_d0[local_198]] = local_194 * local_19c + local_140[local_d0[local_198]];
          }
          local_148 = local_148 + local_a4;
          Mat::~Mat((Mat *)0x15c16d);
        }
      }
    }
    if (*(int *)(in_RDI + 0xac) == 1) {
      local_1a8 = Mat::operator_cast_to_float_(&local_128);
      local_1ac = local_4c * local_50;
      for (local_1b0 = 0; local_1b0 < local_1ac; local_1b0 = local_1b0 + 1) {
        local_1b4 = 0.0;
        pfVar5 = std::max<float>(local_1a8 + local_1b0,&local_1b4);
        local_1a8[local_1b0] = *pfVar5;
      }
    }
    else if (*(int *)(in_RDI + 0xac) == 2) {
      pfVar5 = Mat::operator_cast_to_float_(&local_128);
      iVar4 = local_4c * local_50;
      pfVar6 = Mat::operator[]((Mat *)(in_RDI + 0xb0),0);
      fVar1 = *pfVar6;
      for (local_1cc = 0; local_1cc < iVar4; local_1cc = local_1cc + 1) {
        if (pfVar5[local_1cc] <= 0.0) {
          local_264 = pfVar5[local_1cc] * fVar1;
        }
        else {
          local_264 = pfVar5[local_1cc];
        }
        pfVar5[local_1cc] = local_264;
      }
    }
    else if (*(int *)(in_RDI + 0xac) == 3) {
      pfVar5 = Mat::operator_cast_to_float_(&local_128);
      iVar4 = local_4c * local_50;
      pfVar6 = Mat::operator[]((Mat *)(in_RDI + 0xb0),0);
      fVar1 = *pfVar6;
      pfVar6 = Mat::operator[]((Mat *)(in_RDI + 0xb0),1);
      fVar2 = *pfVar6;
      for (local_1e8 = 0; local_1e8 < iVar4; local_1e8 = local_1e8 + 1) {
        if (pfVar5[local_1e8] < fVar1) {
          pfVar5[local_1e8] = fVar1;
        }
        if (fVar2 < pfVar5[local_1e8]) {
          pfVar5[local_1e8] = fVar2;
        }
      }
    }
    else if (*(int *)(in_RDI + 0xac) == 4) {
      pfVar5 = Mat::operator_cast_to_float_(&local_128);
      iVar4 = local_4c * local_50;
      for (local_1f8 = 0; local_1f8 < iVar4; local_1f8 = local_1f8 + 1) {
        dVar7 = std::exp((double)((ulong)(uint)pfVar5[local_1f8] ^ 0x8000000080000000));
        in_stack_fffffffffffffd74 = SUB84(dVar7,0);
        pfVar5[local_1f8] = 1.0 / (in_stack_fffffffffffffd74 + 1.0);
      }
    }
    Mat::~Mat((Mat *)0x15c60e);
  }
  if ((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) {
    Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
LAB_0015c719:
    local_4 = 0;
  }
  else {
    uVar8 = *(undefined4 *)(local_28 + 4);
    copy_cut_border(in_stack_00000370,in_stack_00000368,in_stack_00000364,in_stack_00000360,
                    in_stack_0000035c,in_stack_00000358,in_stack_00000380,in_stack_00000388);
    bVar3 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd64,uVar8));
    in_stack_fffffffffffffd70 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd70);
    if (!bVar3) {
      local_4c = *(int *)(local_20 + 0x2c);
      local_50 = *(int *)(local_20 + 0x30);
      goto LAB_0015c719;
    }
    local_4 = -100;
  }
  local_a0 = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
LAB_0015c74d:
  Mat::~Mat((Mat *)0x15c75a);
  return local_4;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_w > 0 || pad_h > 0)
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = 1.f / (1.f + exp(-outptr[i]));
            }
        }
    }

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w, opt.blob_allocator, opt.num_threads);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}